

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_clear_free(BIGNUM *a)

{
  int iVar1;
  BIGNUM *unaff_retaddr;
  
  if (a != (BIGNUM *)0x0) {
    if ((a->d != (ulong *)0x0) && (iVar1 = BN_get_flags((BIGNUM *)a,2), iVar1 == 0)) {
      bn_free_d(unaff_retaddr,(int)((ulong)a >> 0x20));
    }
    iVar1 = BN_get_flags((BIGNUM *)a,1);
    if (iVar1 != 0) {
      OPENSSL_cleanse(a,0x18);
      CRYPTO_free(a);
    }
  }
  return;
}

Assistant:

void BN_clear_free(BIGNUM *a)
{
    if (a == NULL)
        return;
    if (a->d != NULL && !BN_get_flags(a, BN_FLG_STATIC_DATA))
        bn_free_d(a, 1);
    if (BN_get_flags(a, BN_FLG_MALLOCED)) {
        OPENSSL_cleanse(a, sizeof(*a));
        OPENSSL_free(a);
    }
}